

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
::moveFromSpan(Span<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
               *this,Span<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
                     *fromSpan,size_t fromIndex,size_t to)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  uchar uVar7;
  uchar *this_00;
  
  uVar7 = this->nextFree;
  if (uVar7 == this->allocated) {
    addStorage(this);
    uVar7 = this->nextFree;
  }
  this->offsets[to] = uVar7;
  pEVar5 = this->entries;
  bVar3 = this->nextFree;
  this->nextFree = pEVar5[bVar3].storage.data[0];
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar1 = fromSpan->entries + bVar4;
  this_00 = (pEVar1->storage).data + 8;
  uVar6 = *(undefined8 *)((pEVar1->storage).data + 8);
  *(undefined8 *)pEVar5[bVar3].storage.data = *(undefined8 *)(pEVar1->storage).data;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 8) = uVar6;
  uVar6 = *(undefined8 *)((pEVar1->storage).data + 0x18);
  puVar2 = pEVar5[bVar3].storage.data + 0x10;
  *(undefined8 *)puVar2 = *(undefined8 *)((pEVar1->storage).data + 0x10);
  *(undefined8 *)(puVar2 + 8) = uVar6;
  this_00[0] = '\0';
  this_00[1] = '\0';
  this_00[2] = '\0';
  this_00[3] = '\0';
  this_00[4] = '\0';
  this_00[5] = '\0';
  this_00[6] = '\0';
  this_00[7] = '\0';
  (pEVar1->storage).data[0x10] = '\0';
  (pEVar1->storage).data[0x11] = '\0';
  (pEVar1->storage).data[0x12] = '\0';
  (pEVar1->storage).data[0x13] = '\0';
  (pEVar1->storage).data[0x14] = '\0';
  (pEVar1->storage).data[0x15] = '\0';
  (pEVar1->storage).data[0x16] = '\0';
  (pEVar1->storage).data[0x17] = '\0';
  (pEVar1->storage).data[0x18] = '\0';
  (pEVar1->storage).data[0x19] = '\0';
  (pEVar1->storage).data[0x1a] = '\0';
  (pEVar1->storage).data[0x1b] = '\0';
  (pEVar1->storage).data[0x1c] = '\0';
  (pEVar1->storage).data[0x1d] = '\0';
  (pEVar1->storage).data[0x1e] = '\0';
  (pEVar1->storage).data[0x1f] = '\0';
  std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::~vector
            ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)this_00);
  (pEVar1->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }